

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::internalCompile(SelectionCompiler *this)

{
  undefined4 uVar1;
  pointer pvVar2;
  pointer pvVar3;
  iterator iVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  TokenMap *this_00;
  Token *pTVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  uint uVar10;
  char cVar11;
  pointer this_01;
  uint uVar12;
  float fVar13;
  Token token;
  string str;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> ltoken;
  Token tokenCommand;
  undefined1 local_110 [8];
  float fStack_108;
  undefined4 uStack_104;
  _Storage _Stack_100;
  string local_f8;
  undefined4 local_d4;
  code *local_d0;
  _Storage local_c8;
  undefined8 local_c0;
  string *local_b8;
  any *local_b0;
  _Storage local_a8;
  float local_9c;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> local_98;
  vector<int,std::allocator<int>> *local_78;
  int *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *local_60;
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 local_3c;
  _Storage *local_38;
  
  this->cchScript = (int)(this->script)._M_string_length;
  this->ichToken = 0;
  this->lineCurrent = 1;
  this->error = false;
  pvVar2 = (this->aatokenCompiled).
           super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->aatokenCompiled).
           super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = pvVar2;
  if (pvVar3 != pvVar2) {
    do {
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pvVar3);
    (this->aatokenCompiled).
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  }
  local_b8 = &this->script;
  local_58 = &this->aatokenCompiled;
  local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = 5;
  local_4c = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  local_3c = 0;
  local_70 = &this->ichCurrentCommand;
  local_60 = &this->atokenCommand;
  local_68 = &this->lineNumbers;
  local_78 = (vector<int,std::allocator<int>> *)&this->lineIndices;
  uVar10 = 0;
  local_d4 = SUB84(local_78,0);
  do {
    bVar6 = lookingAtLeadingWhitespace(this);
    if (bVar6) goto LAB_0027823c;
    bVar6 = lookingAtEndOfLine(this);
    if (bVar6) {
LAB_00277c0d:
      if (uVar10 != 0) {
        bVar7 = compileCommand(this,&local_98);
        if (!bVar7) {
          bVar8 = 0;
          goto LAB_00278285;
        }
        std::
        vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
        ::push_back(local_58,local_60);
        local_f8._M_dataplus._M_p._0_4_ = (int)this->lineCurrent;
        iVar4._M_current =
             (this->lineNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->lineNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_68,iVar4,(int *)&local_f8);
        }
        else {
          *iVar4._M_current = (int)this->lineCurrent;
          (this->lineNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_78,iVar4,local_70);
        }
        else {
          *iVar4._M_current = this->ichCurrentCommand;
          (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::_M_erase_at_end
                  (&local_98,
                   local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      }
      bVar7 = this->ichToken < this->cchScript;
      if (bVar6 && bVar7) {
        this->lineCurrent = this->lineCurrent + 1;
        uVar10 = 0;
      }
      else {
        cVar11 = bVar7 * '\x02' + '\x02';
        uVar10 = 0;
LAB_00278233:
        if (cVar11 != '\x04') {
          bVar8 = (byte)local_d4;
          if (cVar11 == '\x02') {
            bVar8 = 1;
          }
LAB_00278285:
          if ((code *)CONCAT44(uStack_44,uStack_48) != (code *)0x0) {
            (*(code *)CONCAT44(uStack_44,uStack_48))(3,&uStack_48,0);
          }
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector(&local_98);
          return (bool)(bVar8 & 1);
        }
      }
    }
    else {
      if ((this->ichToken != this->cchScript) &&
         ((local_b8->_M_dataplus)._M_p[this->ichToken] == ';')) {
        this->cchToken = 1;
        goto LAB_00277c0d;
      }
      if (uVar10 == 0) {
LAB_00277f54:
        bVar6 = lookingAtLookupToken(this);
        if (bVar6) {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_b8);
          local_110._0_4_ = 5;
          local_110._4_4_ = 0;
          fStack_108 = 0.0;
          uStack_104 = 0;
          _Stack_100._0_4_ = 0;
          _Stack_100._4_4_ = 0;
          this_00 = TokenMap::getInstance();
          pTVar9 = TokenMap::getToken(this_00,&local_f8);
          if (pTVar9 == (Token *)0x0) {
            local_b0 = (any *)std::any::
                              _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::_S_manage;
            local_a8._M_ptr = (void *)0x0;
            std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                      (&local_a8,&local_f8);
            local_d0 = (code *)0x1;
            local_c0 = 0;
            if (local_b0 == (any *)0x0) {
              local_c8._M_ptr = (code *)0x0;
            }
            else {
              local_38 = &local_c8;
              (*(code *)local_b0)(2,&local_b0,&local_38);
            }
            local_110._0_4_ = SUB84(local_d0,0);
            local_110._4_4_ = (undefined4)((ulong)local_d0 >> 0x20);
            std::any::operator=((any *)&fStack_108,(any *)&local_c8);
            if ((code *)local_c8._M_ptr != (code *)0x0) {
              (*(code *)local_c8)(3,&local_c8,0);
              local_c8._M_ptr = (code *)0x0;
            }
            if (local_b0 != (any *)0x0) {
              (*(code *)local_b0)(3,&local_b0,0);
            }
          }
          else {
            uVar1 = pTVar9->tok;
            uVar5 = pTVar9->intValue;
            local_110._0_4_ = uVar1;
            local_110._4_4_ = uVar5;
            std::any::operator=((any *)&fStack_108,&pTVar9->value);
          }
          uVar12 = local_110._0_4_;
          if (uVar10 == 0x302) {
            uVar10 = 0x302;
            if (((uint)local_110._0_4_ >> 10 & 1) != 0 || local_110._0_4_ == 1) goto LAB_002781e9;
            bVar6 = invalidExpressionToken(this,&local_f8);
            local_d4 = (undefined4)CONCAT71(extraout_var_00,bVar6);
            uVar12 = 0x302;
LAB_002781de:
            cVar11 = '\x01';
            uVar10 = uVar12;
          }
          else {
            if (uVar10 == 0x301) {
              if ((long)local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start == 0x18) {
                uVar10 = 0x301;
                if ((local_110._0_4_ & 0x4400) != 0x4400 && local_110._0_4_ != 1) {
LAB_002781c9:
                  bVar6 = invalidExpressionToken(this,&local_f8);
                  local_d4 = (undefined4)CONCAT71(extraout_var_01,bVar6);
                  uVar12 = 0x301;
                  goto LAB_002781de;
                }
              }
              else {
                uVar10 = 0x301;
                if ((local_110._0_4_ & 0x4400) == 0 && local_110._0_4_ != 1) goto LAB_002781c9;
              }
            }
            else if ((uVar10 == 0) &&
                    (this->ichCurrentCommand = this->ichToken, uVar10 = local_110._0_4_,
                    ((uint)local_110._0_4_ >> 8 & 1) == 0)) {
              bVar6 = commandExpected(this);
              local_d4 = (undefined4)CONCAT71(extraout_var,bVar6);
              goto LAB_002781de;
            }
LAB_002781e9:
            cVar11 = '\x04';
            std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                      (&local_98,(value_type *)local_110);
          }
          if ((code *)CONCAT44(uStack_104,fStack_108) != (code *)0x0) {
            (*(code *)CONCAT44(uStack_104,fStack_108))(3,&fStack_108,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00278233;
        }
        if (local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_98.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          bVar8 = commandExpected(this);
        }
        else {
          bVar8 = unrecognizedToken(this);
        }
        goto LAB_00278285;
      }
      bVar6 = lookingAtString(this);
      if (bVar6) {
        getUnescapedStringLiteral_abi_cxx11_(&local_f8,this);
        local_d0 = std::any::
                   _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::_S_manage;
        local_c8._M_ptr = (code *)0x0;
        std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                  (&local_c8,&local_f8);
        local_110._0_4_ = 4;
        local_110._4_4_ = 0;
        _Stack_100._0_4_ = 0;
        _Stack_100._4_4_ = 0;
        if (local_d0 == (code *)0x0) {
          fStack_108 = 0.0;
          uStack_104 = 0;
        }
        else {
          local_b0 = (any *)&fStack_108;
          (*local_d0)(2,&local_d0,&local_b0);
        }
        std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::emplace_back<OpenMD::Token>
                  (&local_98,(Token *)local_110);
        if ((code *)CONCAT44(uStack_104,fStack_108) != (code *)0x0) {
          (*(code *)CONCAT44(uStack_104,fStack_108))(3,&fStack_108,0);
          fStack_108 = 0.0;
          uStack_104 = 0;
        }
        if (local_d0 != (code *)0x0) {
          (*local_d0)(3,&local_d0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar6 = lookingAtDecimal(this,false);
        if (bVar6) {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_b8);
          fVar13 = lexi_cast<float>(&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            local_9c = fVar13;
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            fVar13 = local_9c;
          }
          local_110._0_4_ = 0x263e7c;
          local_110._4_4_ = 0;
          uStack_104 = 0;
          local_f8._M_dataplus._M_p = (pointer)0x3;
          local_f8.field_2._M_allocated_capacity._4_4_ = 0;
          local_f8.field_2._M_allocated_capacity._0_4_ = fVar13;
          local_f8._M_string_length = (size_type)std::any::_Manager_internal<float>::_S_manage;
          fStack_108 = fVar13;
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::emplace_back<OpenMD::Token>
                    (&local_98,(Token *)&local_f8);
          if ((code *)local_f8._M_string_length != (code *)0x0) {
            (*(code *)local_f8._M_string_length)(3,&local_f8._M_string_length,0);
            local_f8._M_string_length = 0;
          }
          if ((code *)CONCAT44(local_110._4_4_,local_110._0_4_) != (code *)0x0) {
            (*(code *)CONCAT44(local_110._4_4_,local_110._0_4_))(3,local_110,0);
          }
        }
        else {
          bVar6 = lookingAtInteger(this,true);
          if (!bVar6) goto LAB_00277f54;
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_b8);
          fVar13 = (float)lexi_cast<int>(&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          local_110._0_4_ = 0x263f22;
          local_110._4_4_ = 0;
          uStack_104 = 0;
          local_f8._M_dataplus._M_p = (pointer)0x2;
          local_f8.field_2._M_allocated_capacity._4_4_ = 0;
          local_f8.field_2._M_allocated_capacity._0_4_ = fVar13;
          local_f8._M_string_length = (size_type)std::any::_Manager_internal<int>::_S_manage;
          fStack_108 = fVar13;
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::emplace_back<OpenMD::Token>
                    (&local_98,(Token *)&local_f8);
          if ((code *)local_f8._M_string_length != (code *)0x0) {
            (*(code *)local_f8._M_string_length)(3,&local_f8._M_string_length,0);
            local_f8._M_string_length = 0;
          }
          if ((code *)CONCAT44(local_110._4_4_,local_110._0_4_) != (code *)0x0) {
            (*(code *)CONCAT44(local_110._4_4_,local_110._0_4_))(3,local_110,0);
          }
        }
      }
    }
LAB_0027823c:
    this->ichToken = this->ichToken + this->cchToken;
  } while( true );
}

Assistant:

bool SelectionCompiler::internalCompile() {
    cchScript   = script.size();
    ichToken    = 0;
    lineCurrent = 1;

    error = false;

    // std::vector<Token> lltoken;
    aatokenCompiled.clear();
    std::vector<Token> ltoken;

    Token tokenCommand;
    int tokCommand = Token::nada;

    for (; true; ichToken += cchToken) {
      if (lookingAtLeadingWhitespace()) continue;
      // if (lookingAtComment())
      //    continue;
      bool endOfLine = lookingAtEndOfLine();
      if (endOfLine || lookingAtEndOfStatement()) {
        if (tokCommand != Token::nada) {
          if (!compileCommand(ltoken)) { return false; }
          aatokenCompiled.push_back(atokenCommand);
          lineNumbers.push_back(lineCurrent);
          lineIndices.push_back(ichCurrentCommand);
          ltoken.clear();
          tokCommand = Token::nada;
        }

        if (ichToken < cchScript) {
          if (endOfLine) ++lineCurrent;
          continue;
        }
        break;
      }

      if (tokCommand != Token::nada) {
        if (lookingAtString()) {
          std::string str = getUnescapedStringLiteral();
          ltoken.push_back(Token(Token::string, str));
          continue;
        }
        // if ((tokCommand & Token::specialstring) != 0 &&
        //    lookingAtSpecialString()) {
        //    std::string str = script.substr(ichToken, ichToken + cchToken);
        //    ltoken.push_back(Token(Token::string, str));
        //    continue;
        //}
        // if (lookingAtDecimal((tokCommand & Token::negnums) != 0)) {
        if (lookingAtDecimal((tokCommand) != 0)) {
          float value = lexi_cast<float>(script.substr(ichToken, cchToken));
          ltoken.push_back(Token(Token::decimal, std::any(value)));
          continue;
        }
        // if (lookingAtInteger((tokCommand & Token::negnums) != 0)) {
        if (lookingAtInteger((tokCommand) != 0)) {
          int val = lexi_cast<int>(script.substr(ichToken, cchToken));
          ltoken.push_back(Token(Token::integer, std::any(val)));
          continue;
        }
      }

      if (lookingAtLookupToken()) {
        std::string ident = script.substr(ichToken, cchToken);
        Token token;
        Token* pToken = TokenMap::getInstance().getToken(ident);
        if (pToken != NULL) {
          token = *pToken;
        } else {
          token = Token(Token::identifier, ident);
        }

        int tok = token.tok;

        switch (tokCommand) {
        case Token::nada:
          ichCurrentCommand = ichToken;
          // tokenCommand = token;
          tokCommand = tok;
          if ((tokCommand & Token::command) == 0) return commandExpected();
          break;

        case Token::define:
          if (ltoken.size() == 1) {
            // we are looking at the variable name
            if (tok != Token::identifier &&
                (tok & Token::predefinedset) != Token::predefinedset)
              return invalidExpressionToken(ident);
          } else {
            // we are looking at the expression
            if (tok != Token::identifier &&
                (tok & (Token::expression | Token::predefinedset)) == 0)
              return invalidExpressionToken(ident);
          }

          break;

        case Token::select:
          if (tok != Token::identifier && (tok & Token::expression) == 0)
            return invalidExpressionToken(ident);
          break;
        }
        ltoken.push_back(token);
        continue;
      }

      if (ltoken.empty()) { return commandExpected(); }

      return unrecognizedToken();
    }

    return true;
  }